

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O1

void __thiscall Fir1::Fir1(Fir1 *this,double *_coefficients,uint number_of_taps)

{
  ulong __n;
  double *__dest;
  double *__s;
  size_t __n_00;
  
  __n = (ulong)number_of_taps * 8;
  __dest = (double *)operator_new__(__n);
  this->coefficients = __dest;
  __s = (double *)operator_new__(__n);
  memset(__s,0,__n);
  this->buffer = __s;
  this->taps = number_of_taps;
  this->offset = 0;
  this->mu = 0.0;
  if (number_of_taps != 0) {
    __n_00 = (ulong)number_of_taps << 3;
    memset(__s,0,__n_00);
    memcpy(__dest,_coefficients,__n_00);
    return;
  }
  return;
}

Assistant:

Fir1::Fir1(const double *_coefficients,const unsigned number_of_taps) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]()),
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}